

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::generateDES3
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  ulong uVar1;
  _func_int *p_Var2;
  void *pvVar3;
  CK_OBJECT_HANDLE_PTR pCVar4;
  SoftHSM *pSVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  Session *this_00;
  SymmetricKey *pSVar10;
  CryptoFactory *pCVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  long lVar13;
  CK_RV CVar14;
  long *plVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CK_ULONG CVar16;
  CK_ULONG CVar17;
  unsigned_long *puVar18;
  uint uVar19;
  undefined7 uVar21;
  undefined8 uVar20;
  bool bVar22;
  ByteString kcv;
  ByteString value;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_ATTRIBUTE keyAttribs [32];
  CK_BBOOL local_469;
  SymmetricKey *local_468;
  uint local_45c;
  long *local_458;
  CK_OBJECT_HANDLE_PTR local_450;
  Token *local_448;
  SoftHSM *local_440;
  undefined1 local_438 [160];
  ByteString local_398;
  ByteString local_370;
  undefined8 local_348;
  undefined8 local_340;
  _CK_ATTRIBUTE local_338;
  undefined8 local_320;
  CK_BBOOL *local_318;
  undefined8 local_310;
  undefined8 local_308;
  CK_BBOOL *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined8 local_2e0;
  
  *phKey = 0;
  local_469 = isOnToken;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_448 = Session::getToken(this_00);
  if (local_448 == (Token *)0x0) {
    return 5;
  }
  uVar21 = (undefined7)((ulong)phKey >> 8);
  local_450 = phKey;
  if (ulCount == 0) {
    uVar19 = (uint)CONCAT71(uVar21,1);
  }
  else {
    puVar18 = &pTemplate->ulValueLen;
    uVar20 = CONCAT71(uVar21,1);
    CVar16 = ulCount;
    do {
      if (((_CK_ATTRIBUTE *)(puVar18 + -2))->type == 0x90) {
        if (*puVar18 != 0) {
          softHSMLog(6,"generateDES3",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x202f,"CKA_CHECK_VALUE must be a no-value (0 length) entry");
          return 0x13;
        }
        uVar20 = 0;
      }
      uVar19 = (uint)uVar20;
      puVar18 = puVar18 + 3;
      CVar16 = CVar16 - 1;
    } while (CVar16 != 0);
  }
  local_440 = this;
  pSVar10 = (SymmetricKey *)operator_new(0x38);
  SymmetricKey::SymmetricKey(pSVar10,0xa8);
  (pSVar10->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019b2f0;
  pCVar11 = CryptoFactory::i();
  iVar9 = (**pCVar11->_vptr_CryptoFactory)(pCVar11,3);
  local_458 = (long *)CONCAT44(extraout_var,iVar9);
  if (local_458 == (long *)0x0) {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x203e,"Could not get SymmetricAlgorithm");
    (*(pSVar10->super_Serialisable)._vptr_Serialisable[2])(pSVar10);
    return 5;
  }
  local_468 = pSVar10;
  pCVar11 = CryptoFactory::i();
  iVar9 = (*pCVar11->_vptr_CryptoFactory[8])(pCVar11,1);
  plVar15 = local_458;
  pSVar10 = local_468;
  if (CONCAT44(extraout_var_00,iVar9) == 0) {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2045,"Could not get RNG");
    lVar13 = *local_458;
    pSVar10 = local_468;
    plVar15 = local_458;
LAB_0013a1ab:
    (**(code **)(lVar13 + 0x50))(plVar15,pSVar10);
    pCVar11 = CryptoFactory::i();
    (*pCVar11->_vptr_CryptoFactory[1])(pCVar11,plVar15);
    return 5;
  }
  local_45c = uVar19;
  cVar6 = (**(code **)(*local_458 + 0x58))(local_458,local_468,CONCAT44(extraout_var_00,iVar9));
  if (cVar6 == '\0') {
    softHSMLog(3,"generateDES3",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x204c,"Could not generate DES secret key");
    lVar13 = *plVar15;
    goto LAB_0013a1ab;
  }
  local_340 = 4;
  local_348 = 0x15;
  memset(&local_338,0,0x300);
  pSVar5 = local_440;
  uVar19 = local_45c;
  local_338.ulValueLen = 8;
  local_320 = 1;
  local_318 = &local_469;
  local_310 = 1;
  local_308 = 2;
  local_300 = &isPrivate;
  local_2f8 = 1;
  local_2f0 = 0x100;
  local_2e0 = 8;
  local_338.pValue = &local_340;
  local_2e8 = &local_348;
  if (ulCount - 1 < 0x1c) {
    uVar12 = 1;
    CVar17 = 4;
    do {
      uVar1 = pTemplate->type;
      CVar16 = CVar17;
      if (((2 < uVar1) && (uVar1 != 0x90)) && (uVar1 != 0x100)) {
        CVar16 = CVar17 + 1;
        (&local_338)[CVar17].ulValueLen = pTemplate->ulValueLen;
        pvVar3 = pTemplate->pValue;
        (&local_338)[CVar17].type = pTemplate->type;
        (&local_338)[CVar17].pValue = pvVar3;
      }
      if (0x1c < ulCount) break;
      pTemplate = pTemplate + 1;
      bVar22 = uVar12 < ulCount;
      uVar12 = uVar12 + 1;
      CVar17 = CVar16;
    } while (bVar22);
  }
  else {
    CVar16 = 4;
    CVar14 = 0xd1;
    if (0x1c < ulCount) goto LAB_0013a213;
  }
  CVar14 = CreateObject(local_440,hSession,&local_338,CVar16,local_450,4);
  if (CVar14 != 0) goto LAB_0013a213;
  plVar15 = (long *)HandleManager::getObject(pSVar5->handleManager,*local_450);
  CVar14 = 6;
  if (((plVar15 == (long *)0x0) || (cVar6 = (**(code **)(*plVar15 + 0x50))(plVar15), cVar6 == '\0'))
     || (cVar6 = (**(code **)(*plVar15 + 0x58))(plVar15,1), cVar6 == '\0')) goto LAB_0013a213;
  OSAttribute::OSAttribute((OSAttribute *)local_438,true);
  cVar6 = (**(code **)(*plVar15 + 0x40))(plVar15,0x163,(OSAttribute *)local_438);
  OSAttribute::~OSAttribute((OSAttribute *)local_438);
  if (cVar6 == '\0') {
    (**(code **)(*plVar15 + 0x20))(plVar15,0x103,0);
LAB_0013a3e4:
    pSVar10 = local_468;
    cVar6 = '\0';
    (**(code **)(*plVar15 + 0x20))(plVar15,0x162,0);
  }
  else {
    OSAttribute::OSAttribute((OSAttribute *)local_438,0x131);
    cVar6 = (**(code **)(*plVar15 + 0x40))(plVar15,0x166,(OSAttribute *)local_438);
    OSAttribute::~OSAttribute((OSAttribute *)local_438);
    bVar22 = (bool)(**(code **)(*plVar15 + 0x20))(plVar15,0x103,0);
    pSVar10 = local_468;
    if (cVar6 == '\0') goto LAB_0013a3e4;
    OSAttribute::OSAttribute((OSAttribute *)local_438,bVar22);
    cVar7 = (**(code **)(*plVar15 + 0x40))(plVar15,0x165,(OSAttribute *)local_438);
    OSAttribute::~OSAttribute((OSAttribute *)local_438);
    cVar6 = '\0';
    bVar8 = (**(code **)(*plVar15 + 0x20))(plVar15,0x162,0);
    if (cVar7 != '\0') {
      OSAttribute::OSAttribute((OSAttribute *)local_438,(bool)(bVar8 ^ 1));
      cVar6 = (**(code **)(*plVar15 + 0x40))(plVar15,0x164,(OSAttribute *)local_438);
      OSAttribute::~OSAttribute((OSAttribute *)local_438);
    }
  }
  ByteString::ByteString(&local_370);
  ByteString::ByteString(&local_398);
  p_Var2 = (pSVar10->super_Serialisable)._vptr_Serialisable[4];
  if (isPrivate == '\0') {
    iVar9 = (*p_Var2)(pSVar10);
    ByteString::operator=(&local_370,(ByteString *)CONCAT44(extraout_var_02,iVar9));
    (*(pSVar10->super_Serialisable)._vptr_Serialisable[5])(local_438,pSVar10);
    ByteString::operator=(&local_398,(ByteString *)local_438);
  }
  else {
    iVar9 = (*p_Var2)(pSVar10);
    Token::encrypt(local_448,(char *)CONCAT44(extraout_var_01,iVar9),(int)&local_370);
    (*(pSVar10->super_Serialisable)._vptr_Serialisable[5])(local_438,pSVar10);
    Token::encrypt(local_448,local_438,(int)&local_398);
  }
  local_438._0_8_ = &PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_> *)(local_438 + 8));
  if (cVar6 == '\0') {
LAB_0013a53e:
    (**(code **)(*plVar15 + 0x68))(plVar15);
    cVar6 = '\0';
  }
  else {
    OSAttribute::OSAttribute((OSAttribute *)local_438,&local_370);
    cVar6 = (**(code **)(*plVar15 + 0x40))(plVar15,0x11,local_438);
    OSAttribute::~OSAttribute((OSAttribute *)local_438);
    if ((uVar19 & 1) != 0) {
      if (cVar6 == '\0') goto LAB_0013a53e;
      OSAttribute::OSAttribute((OSAttribute *)local_438,&local_398);
      cVar6 = (**(code **)(*plVar15 + 0x40))(plVar15,0x90,local_438);
      OSAttribute::~OSAttribute((OSAttribute *)local_438);
    }
    if (cVar6 == '\0') goto LAB_0013a53e;
    cVar6 = (**(code **)(*plVar15 + 0x60))(plVar15);
  }
  local_398._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_398.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  local_370._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_370.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  CVar14 = 6;
  if (cVar6 != '\0') {
    CVar14 = 0;
  }
LAB_0013a213:
  plVar15 = local_458;
  (**(code **)(*local_458 + 0x50))(local_458,local_468);
  pCVar11 = CryptoFactory::i();
  (*pCVar11->_vptr_CryptoFactory[1])(pCVar11,plVar15);
  pCVar4 = local_450;
  if (CVar14 == 0) {
    return 0;
  }
  if (*local_450 == 0) {
    return CVar14;
  }
  plVar15 = (long *)HandleManager::getObject(pSVar5->handleManager,*local_450);
  HandleManager::destroyObject(pSVar5->handleManager,*pCVar4);
  if (plVar15 != (long *)0x0) {
    (**(code **)(*plVar15 + 0x70))(plVar15);
  }
  *pCVar4 = 0;
  return CVar14;
}

Assistant:

CK_RV SoftHSM::generateDES3
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	bool checkValue = true;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				if (pTemplate[i].ulValueLen > 0)
				{
					INFO_MSG("CKA_CHECK_VALUE must be a no-value (0 length) entry");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				checkValue = false;
				break;
			default:
				break;
		}
	}

	// Generate the secret key
	DESKey* key = new DESKey(168);
	SymmetricAlgorithm* des = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::DES3);
	if (des == NULL)
	{
		ERROR_MSG("Could not get SymmetricAlgorithm");
		delete key;
		return CKR_GENERAL_ERROR;
	}
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL)
	{
		ERROR_MSG("Could not get RNG");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}
	if (!des->generateKey(*key, rng))
	{
		ERROR_MSG("Could not generate DES secret key");
		des->recycleKey(key);
		CryptoFactory::i()->recycleSymmetricAlgorithm(des);
		return CKR_GENERAL_ERROR;
	}

	CK_RV rv = CKR_OK;

	// Create the secret key object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_SECRET_KEY;
	CK_KEY_TYPE keyType = CKK_DES3;
	CK_ATTRIBUTE keyAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG keyAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - keyAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
			case CKA_CHECK_VALUE:
				continue;
		default:
			keyAttribs[keyAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, keyAttribs, keyAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DES3_KEY_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// Common Secret Key Attributes
			bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
			bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

			// DES Secret Key Attributes
			ByteString value;
			ByteString kcv;
			if (isPrivate)
			{
				token->encrypt(key->getKeyBits(), value);
				token->encrypt(key->getKeyCheckValue(), kcv);
			}
			else
			{
				value = key->getKeyBits();
				kcv = key->getKeyCheckValue();
			}
			bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			if (checkValue)
				bOK = bOK && osobject->setAttribute(CKA_CHECK_VALUE, kcv);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	des->recycleKey(key);
	CryptoFactory::i()->recycleSymmetricAlgorithm(des);

	// Remove the key that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* oskey = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (oskey) oskey->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}